

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

void __thiscall llvm::SourceMgr::PrintIncludeStack(SourceMgr *this,SMLoc IncludeLoc,raw_ostream *OS)

{
  StringRef Str;
  bool bVar1;
  uint uVar2;
  int iVar3;
  SrcBuffer *pSVar4;
  raw_ostream *prVar5;
  pointer pMVar6;
  undefined4 extraout_var;
  size_t extraout_RDX;
  uint CurBuf;
  raw_ostream *local_20;
  raw_ostream *OS_local;
  SourceMgr *this_local;
  SMLoc IncludeLoc_local;
  
  local_20 = OS;
  OS_local = (raw_ostream *)this;
  this_local = (SourceMgr *)IncludeLoc.Ptr;
  memset(&stack0xffffffffffffffd8,0,8);
  SMLoc::SMLoc((SMLoc *)&stack0xffffffffffffffd8);
  bVar1 = SMLoc::operator==((SMLoc *)&this_local,(SMLoc *)&stack0xffffffffffffffd8);
  if (!bVar1) {
    uVar2 = FindBufferContainingLoc(this,(SMLoc)this_local);
    if (uVar2 == 0) {
      __assert_fail("CurBuf && \"Invalid or unspecified location!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                    ,0x9f,"void llvm::SourceMgr::PrintIncludeStack(SMLoc, raw_ostream &) const");
    }
    pSVar4 = getBufferInfo(this,uVar2);
    PrintIncludeStack(this,(SMLoc)(pSVar4->IncludeLoc).Ptr,local_20);
    prVar5 = raw_ostream::operator<<(local_20,"Included from ");
    pSVar4 = getBufferInfo(this,uVar2);
    pMVar6 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->(&pSVar4->Buffer);
    iVar3 = (*pMVar6->_vptr_MemoryBuffer[2])();
    Str.Data._4_4_ = extraout_var;
    Str.Data._0_4_ = iVar3;
    Str.Length = extraout_RDX;
    prVar5 = raw_ostream::operator<<(prVar5,Str);
    prVar5 = raw_ostream::operator<<(prVar5,":");
    uVar2 = FindLineNumber(this,(SMLoc)this_local,uVar2);
    prVar5 = raw_ostream::operator<<(prVar5,uVar2);
    raw_ostream::operator<<(prVar5,":\n");
  }
  return;
}

Assistant:

void SourceMgr::PrintIncludeStack(SMLoc IncludeLoc, raw_ostream &OS) const {
  if (IncludeLoc == SMLoc()) return;  // Top of stack.

  unsigned CurBuf = FindBufferContainingLoc(IncludeLoc);
  assert(CurBuf && "Invalid or unspecified location!");

  PrintIncludeStack(getBufferInfo(CurBuf).IncludeLoc, OS);

  OS << "Included from "
     << getBufferInfo(CurBuf).Buffer->getBufferIdentifier()
     << ":" << FindLineNumber(IncludeLoc, CurBuf) << ":\n";
}